

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPath.c
# Opt level: O3

void Abc_GraphSolve(Gia_Man_t *pGia)

{
  uint __exponent;
  int iVar1;
  int iVar2;
  Cnf_Dat_t *p;
  Vec_Int_t *p_00;
  int *pLits;
  sat_solver *s;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  int i_3;
  ulong uVar6;
  uint nLits;
  ulong uVar7;
  long lVar8;
  int i;
  int iVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double local_58;
  
  p = (Cnf_Dat_t *)Mf_ManGenerateCnf(pGia,8,0,1,0,0);
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  pLits = (int *)malloc(400);
  p_00->pArray = pLits;
  __exponent = pGia->vCis->nSize;
  iVar2 = p->nVars;
  s = sat_solver_new();
  sat_solver_setnvars(s,p->nVars);
  lVar8 = 0;
  while (lVar8 < p->nClauses) {
    iVar1 = sat_solver_addclause(s,p->pClauses[lVar8],p->pClauses[lVar8 + 1]);
    lVar8 = lVar8 + 1;
    if (iVar1 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilPath.c"
                    ,0x231,"void Abc_GraphSolve(Gia_Man_t *)");
    }
  }
  p_00->nSize = 0;
  if ((int)__exponent < 1) {
    nLits = 0;
  }
  else {
    iVar9 = -__exponent;
    iVar1 = iVar2 * 2 + __exponent * -2 + 1;
    do {
      if (iVar2 + iVar9 < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      Vec_IntPush(p_00,iVar1);
      iVar1 = iVar1 + 2;
      iVar9 = iVar9 + 1;
    } while (iVar9 != 0);
    pLits = p_00->pArray;
    nLits = p_00->nSize;
  }
  iVar2 = sat_solver_solve_lexsat(s,pLits,nLits);
  if (iVar2 == 1) {
    uVar10 = (ulong)nLits;
    uVar6 = 0;
    uVar4 = 0;
    iVar2 = 0;
    do {
      if ((int)nLits < 1) {
        iVar1 = sat_solver_addclause(s,pLits,pLits + (int)nLits);
        if (iVar1 == 0) goto LAB_00497d79;
LAB_00497d45:
        uVar4 = 0;
      }
      else {
        uVar3 = 0;
        do {
          if (pLits[uVar3] < 0) goto LAB_00497ef6;
          pLits[uVar3] = pLits[uVar3] ^ 1;
          uVar3 = uVar3 + 1;
        } while (uVar10 != uVar3);
        iVar1 = sat_solver_addclause(s,pLits,pLits + (int)nLits);
        if (iVar1 == 0) goto LAB_00497d79;
        if ((int)nLits < 1) goto LAB_00497d45;
        uVar4 = 0;
        do {
          if (pLits[uVar4] < 0) {
LAB_00497ef6:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x131,"int Abc_LitNot(int)");
          }
          pLits[uVar4] = pLits[uVar4] ^ 1;
          uVar4 = uVar4 + 1;
        } while (uVar10 != uVar4);
        if ((int)nLits < 1) goto LAB_00497d45;
        uVar3 = 0;
        uVar4 = 0;
        uVar5 = __exponent;
        do {
          uVar5 = uVar5 - 1;
          if (pLits[uVar3] < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x130,"int Abc_LitIsCompl(int)");
          }
          uVar7 = 1L << ((byte)uVar5 & 0x3f);
          if ((pLits[uVar3] & 1U) != 0) {
            uVar7 = 0;
          }
          uVar4 = uVar4 | uVar7;
          uVar3 = uVar3 + 1;
        } while (uVar10 != uVar3);
      }
      if (uVar6 == 0) {
        uVar6 = uVar4;
      }
      iVar2 = iVar2 + 1;
      if ((iVar2 == 1000) || (iVar1 = sat_solver_solve_lexsat(s,pLits,nLits), iVar1 != 1))
      goto LAB_00497d79;
    } while( true );
  }
  uVar6 = 0;
  uVar4 = 0;
LAB_00497d79:
  local_58 = 0.0;
  uVar10 = 0;
  do {
    if ((uVar4 - uVar6 >> (uVar10 & 0x3f) & 1) != 0) {
      dVar11 = exp2((double)(int)uVar10);
      local_58 = local_58 + dVar11;
    }
    uVar10 = uVar10 + 1;
  } while (uVar10 != 0x40);
  uVar4 = (uVar4 - uVar6) / 1000;
  uVar10 = 0;
  do {
    if ((uVar4 >> (uVar10 & 0x3f) & 1) != 0) {
      exp2((double)(int)uVar10);
    }
    uVar10 = uVar10 + 1;
  } while (uVar10 != 0x40);
  printf("Vars = %d   Iters = %d   Ave = %.0f   Total = %.0f  ",local_58,(ulong)__exponent,1000);
  dVar11 = ldexp(1.0,__exponent);
  local_58 = 0.0;
  uVar10 = 0;
  do {
    if ((uVar6 >> (uVar10 & 0x3f) & 1) != 0) {
      dVar12 = exp2((double)(int)uVar10);
      local_58 = local_58 + dVar12;
    }
    uVar10 = uVar10 + 1;
  } while (uVar10 != 0x40);
  dVar12 = 0.0;
  uVar6 = 0;
  do {
    if ((uVar4 >> (uVar6 & 0x3f) & 1) != 0) {
      dVar13 = exp2((double)(int)uVar6);
      dVar12 = dVar12 + dVar13;
    }
    uVar6 = uVar6 + 1;
  } while (uVar6 != 0x40);
  printf("Estimate = %.0f\n",(dVar11 - local_58) / dVar12);
  sat_solver_delete(s);
  Cnf_DataFree(p);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
  }
  free(p_00);
  return;
}

Assistant:

void Abc_GraphSolve( Gia_Man_t * pGia )
{
    int nIters = 1000;
    Cnf_Dat_t * pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( pGia, 8, 0, 1, 0, 0 );
    sat_solver * pSat; Vec_Int_t * vLits = Vec_IntAlloc( 100 );
    int i, k, iLit, nVars = Gia_ManCiNum(pGia);
    int iCiVarBeg = pCnf->nVars - nVars;
    word Total = 0;
    word Mint1 = 0;
    word Mint2 = 0;

    // restart the SAT solver
    pSat = sat_solver_new();
    sat_solver_setnvars( pSat, pCnf->nVars );
    // add timeframe clauses
    for ( i = 0; i < pCnf->nClauses; i++ )
        if ( !sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
            assert( 0 );
    // create trivial assignment
    Vec_IntClear( vLits );
    for ( k = 0; k < nVars; k++ )
        Vec_IntPush( vLits, Abc_Var2Lit(iCiVarBeg+k, 1) );
    // generate random assignment
    for ( i = 0; i < nIters; i++ )
    {
        int Status = sat_solver_solve_lexsat( pSat, Vec_IntArray(vLits), Vec_IntSize(vLits) );
        if ( Status != l_True )
            break;
        assert( Status == l_True );
        // block this assignment
        Vec_IntForEachEntry( vLits, iLit, k )
            Vec_IntWriteEntry( vLits, k, Abc_LitNot(iLit) );
        if ( !sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits) ) )
            break;
        Vec_IntForEachEntry( vLits, iLit, k )
            Vec_IntWriteEntry( vLits, k, Abc_LitNot(iLit) );
        // collect new minterm
        Mint2 = 0;
        Vec_IntForEachEntry( vLits, iLit, k )
            if ( !Abc_LitIsCompl(iLit) )
                Mint2 |= ((word)1) << (nVars-1-k);
        if ( Mint1 == 0 )
            Mint1 = Mint2;
        // report
        //printf( "Iter %3d : ", i );
        //Extra_PrintBinary( stdout, (unsigned *)&Mint2, Abc_MinInt(64, nVars) ); printf( "\n" );
    }
    //Mint1 = 0;
    Total = (Mint2-Mint1)/nIters;
    printf( "Vars = %d   Iters = %d   Ave = %.0f   Total = %.0f  ", nVars, nIters, Abc_Word2Double(Mint2-Mint1), Abc_Word2Double(Total) );
    printf( "Estimate = %.0f\n", (pow(2,nVars)-Abc_Word2Double(Mint1))/Abc_Word2Double((Mint2-Mint1)/nIters) );

    sat_solver_delete( pSat );
    Cnf_DataFree( pCnf );
    Vec_IntFree( vLits );
}